

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native_object.cpp
# Opt level: O1

void __thiscall
mjs::native_object::native_object_property::native_object_property
          (native_object_property *this,char *name,property_attribute attributes,get_func get,
          put_func put)

{
  size_t sVar1;
  
  this->attributes = attributes;
  this->get = get;
  this->put = put;
  sVar1 = strlen(name);
  if (sVar1 < 0x20) {
    strcpy(this->name,name);
    return;
  }
  __assert_fail("std::strlen(name) < sizeof(this->name)",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/native_object.cpp"
                ,0x49,
                "mjs::native_object::native_object_property::native_object_property(const char *, property_attribute, get_func, put_func)"
               );
}

Assistant:

native_object::native_object_property::native_object_property(const char* name, property_attribute attributes, get_func get, put_func put)
    : attributes(attributes)
    , get(get)
    , put(put) {
    assert(std::strlen(name) < sizeof(this->name));
    strcpy(this->name, name);
}